

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O1

int Io_ReadFindCiId(Abc_Ntk_t *pNtk,Abc_Obj_t *pObj)

{
  long lVar1;
  long lVar2;
  
  lVar1 = (long)pNtk->vCis->nSize;
  if (0 < lVar1) {
    lVar2 = 0;
    do {
      if ((Abc_Obj_t *)pNtk->vCis->pArray[lVar2] == pObj) {
        return (int)lVar2;
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
  }
  return -1;
}

Assistant:

int Io_ReadFindCiId( Abc_Ntk_t * pNtk, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pTemp;
    int i;
    Abc_NtkForEachCi( pNtk, pTemp, i )
        if ( pTemp == pObj )
            return i;
    return -1;
}